

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

xmlChar * xmlParseStartTag(xmlParserCtxtPtr ctxt)

{
  byte bVar1;
  xmlChar xVar2;
  xmlChar *pxVar3;
  byte *pbVar4;
  unsigned_long uVar5;
  startElementSAXFunc p_Var6;
  int iVar7;
  xmlChar *str2;
  xmlChar **ppxVar8;
  xmlParserInputPtr pxVar9;
  xmlChar *pxVar10;
  long lVar11;
  xmlChar **ppxVar12;
  long lVar13;
  int local_5c;
  xmlChar *attvalue;
  ulong local_50;
  xmlChar *local_48;
  xmlParserCtxtPtr local_40;
  int local_34;
  
  pxVar9 = ctxt->input;
  pxVar3 = pxVar9->cur;
  if (*pxVar3 == '<') {
    ppxVar12 = ctxt->atts;
    local_5c = ctxt->maxatts;
    pxVar9->col = pxVar9->col + 1;
    pxVar9->cur = pxVar3 + 1;
    if (pxVar3[1] == '\0') {
      xmlParserInputGrow(pxVar9,0xfa);
    }
    local_48 = xmlParseName(ctxt);
    if (local_48 != (xmlChar *)0x0) {
      xmlSkipBlankChars(ctxt);
      if ((ctxt->progressive == 0) && ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
        xmlGROW(ctxt);
      }
      local_50 = 0;
      local_40 = ctxt;
LAB_0015e7e8:
      do {
        pxVar9 = ctxt->input;
        pbVar4 = pxVar9->cur;
        bVar1 = *pbVar4;
        if (bVar1 == 0x2f) {
          if (pbVar4[1] == 0x3e) goto LAB_0015eae0;
        }
        else if ((bVar1 == 0x3e) || ((1 < (byte)(bVar1 - 9) && (bVar1 != 0xd && bVar1 < 0x20))))
        goto LAB_0015eae0;
        if (ctxt->instate == XML_PARSER_EOF) goto LAB_0015eae0;
        local_34 = pxVar9->id;
        uVar5 = pxVar9->consumed;
        pxVar3 = pxVar9->base;
        str2 = xmlParseAttribute(ctxt,&attvalue);
        pxVar10 = attvalue;
        ppxVar8 = ppxVar12;
        if (attvalue == (xmlChar *)0x0 || str2 == (xmlChar *)0x0) {
          if (attvalue != (xmlChar *)0x0) {
            (*xmlFree)(attvalue);
          }
        }
        else {
          lVar13 = (long)(int)local_50;
          lVar11 = 0;
          do {
            ctxt = local_40;
            if (lVar13 <= lVar11) {
              if (ppxVar12 == (xmlChar **)0x0) {
                ppxVar8 = (xmlChar **)(*xmlMalloc)(0xb0);
                ctxt = local_40;
                if (ppxVar8 == (xmlChar **)0x0) {
                  xmlErrMemory(local_40,(char *)0x0);
                  (*xmlFree)(pxVar10);
                  local_5c = 0x16;
                  ppxVar8 = (xmlChar **)0x0;
                  goto LAB_0015e97f;
                }
                local_5c = 0x16;
LAB_0015e93d:
                ctxt->atts = ppxVar8;
                ctxt->maxatts = local_5c;
              }
              else if (local_5c < (int)local_50 + 4) {
                local_5c = local_5c * 2;
                ppxVar8 = (xmlChar **)(*xmlRealloc)(ppxVar12,(long)local_5c << 3);
                if (ppxVar8 != (xmlChar **)0x0) goto LAB_0015e93d;
                xmlErrMemory(ctxt,(char *)0x0);
                goto LAB_0015e8a2;
              }
              ppxVar8[lVar13] = str2;
              local_50 = (ulong)((int)local_50 + 2);
              ppxVar8[lVar13 + 1] = attvalue;
              ppxVar8[lVar13 + 2] = (xmlChar *)0x0;
              (ppxVar8 + lVar13 + 2)[1] = (xmlChar *)0x0;
              goto LAB_0015e97f;
            }
            iVar7 = xmlStrEqual(ppxVar12[lVar11],str2);
            ctxt = local_40;
            lVar11 = lVar11 + 2;
          } while (iVar7 == 0);
          xmlErrAttributeDup(local_40,(xmlChar *)0x0,str2);
LAB_0015e8a2:
          (*xmlFree)(pxVar10);
          ppxVar8 = ppxVar12;
        }
LAB_0015e97f:
        pxVar9 = ctxt->input;
        if ((ctxt->progressive == 0) && ((long)pxVar9->end - (long)pxVar9->cur < 0xfa)) {
          xmlGROW(ctxt);
          pxVar9 = ctxt->input;
        }
        xVar2 = *pxVar9->cur;
        if (xVar2 == '/') {
          xVar2 = pxVar9->cur[1];
        }
        ppxVar12 = ppxVar8;
        if (xVar2 == '>') goto LAB_0015eae0;
        iVar7 = xmlSkipBlankChars(ctxt);
        if (iVar7 == 0) {
          xmlFatalErrMsg(ctxt,XML_ERR_SPACE_REQUIRED,"attributes construct error\n");
        }
        pxVar9 = ctxt->input;
        pxVar10 = pxVar9->cur;
        lVar13 = (long)pxVar10 - (long)pxVar9->base;
        if ((((pbVar4 + (uVar5 - (long)pxVar3) == (byte *)(pxVar9->consumed + lVar13)) &&
             (str2 == (xmlChar *)0x0)) && (local_34 == pxVar9->id)) && (attvalue == (xmlChar *)0x0))
        {
          xmlFatalErrMsg(ctxt,XML_ERR_INTERNAL_ERROR,
                         "xmlParseStartTag: problem parsing attributes\n");
LAB_0015eae0:
          if (((ctxt->sax != (_xmlSAXHandler *)0x0) &&
              (p_Var6 = ctxt->sax->startElement, p_Var6 != (startElementSAXFunc)0x0)) &&
             (ctxt->disableSAX == 0)) {
            ppxVar8 = (xmlChar **)0x0;
            if (0 < (int)local_50) {
              ppxVar8 = ppxVar12;
            }
            (*p_Var6)(ctxt->userData,local_48,ppxVar8);
          }
          if (ppxVar12 == (xmlChar **)0x0) {
            return local_48;
          }
          lVar11 = (long)(int)local_50;
          for (lVar13 = 1; lVar13 < lVar11; lVar13 = lVar13 + 2) {
            if (ppxVar12[lVar13] != (xmlChar *)0x0) {
              (*xmlFree)(ppxVar12[lVar13]);
            }
          }
          return local_48;
        }
      } while (ctxt->progressive != 0);
      if (500 < lVar13) {
        if (((long)pxVar9->end - (long)pxVar10 < 500) && (xmlSHRINK(ctxt), ctxt->progressive != 0))
        goto LAB_0015e7e8;
        pxVar9 = ctxt->input;
        pxVar10 = pxVar9->cur;
      }
      if ((long)pxVar9->end - (long)pxVar10 < 0xfa) {
        xmlGROW(ctxt);
      }
      goto LAB_0015e7e8;
    }
    xmlFatalErrMsg(ctxt,XML_ERR_NAME_REQUIRED,"xmlParseStartTag: invalid element name\n");
  }
  return (xmlChar *)0x0;
}

Assistant:

const xmlChar *
xmlParseStartTag(xmlParserCtxtPtr ctxt) {
    const xmlChar *name;
    const xmlChar *attname;
    xmlChar *attvalue;
    const xmlChar **atts = ctxt->atts;
    int nbatts = 0;
    int maxatts = ctxt->maxatts;
    int i;

    if (RAW != '<') return(NULL);
    NEXT1;

    name = xmlParseName(ctxt);
    if (name == NULL) {
	xmlFatalErrMsg(ctxt, XML_ERR_NAME_REQUIRED,
	     "xmlParseStartTag: invalid element name\n");
        return(NULL);
    }

    /*
     * Now parse the attributes, it ends up with the ending
     *
     * (S Attribute)* S?
     */
    SKIP_BLANKS;
    GROW;

    while (((RAW != '>') &&
	   ((RAW != '/') || (NXT(1) != '>')) &&
	   (IS_BYTE_CHAR(RAW))) && (ctxt->instate != XML_PARSER_EOF)) {
        int id = ctxt->input->id;
	unsigned long cons = CUR_CONSUMED;

	attname = xmlParseAttribute(ctxt, &attvalue);
        if ((attname != NULL) && (attvalue != NULL)) {
	    /*
	     * [ WFC: Unique Att Spec ]
	     * No attribute name may appear more than once in the same
	     * start-tag or empty-element tag.
	     */
	    for (i = 0; i < nbatts;i += 2) {
	        if (xmlStrEqual(atts[i], attname)) {
		    xmlErrAttributeDup(ctxt, NULL, attname);
		    xmlFree(attvalue);
		    goto failed;
		}
	    }
	    /*
	     * Add the pair to atts
	     */
	    if (atts == NULL) {
	        maxatts = 22; /* allow for 10 attrs by default */
	        atts = (const xmlChar **)
		       xmlMalloc(maxatts * sizeof(xmlChar *));
		if (atts == NULL) {
		    xmlErrMemory(ctxt, NULL);
		    if (attvalue != NULL)
			xmlFree(attvalue);
		    goto failed;
		}
		ctxt->atts = atts;
		ctxt->maxatts = maxatts;
	    } else if (nbatts + 4 > maxatts) {
	        const xmlChar **n;

	        maxatts *= 2;
	        n = (const xmlChar **) xmlRealloc((void *) atts,
					     maxatts * sizeof(const xmlChar *));
		if (n == NULL) {
		    xmlErrMemory(ctxt, NULL);
		    if (attvalue != NULL)
			xmlFree(attvalue);
		    goto failed;
		}
		atts = n;
		ctxt->atts = atts;
		ctxt->maxatts = maxatts;
	    }
	    atts[nbatts++] = attname;
	    atts[nbatts++] = attvalue;
	    atts[nbatts] = NULL;
	    atts[nbatts + 1] = NULL;
	} else {
	    if (attvalue != NULL)
		xmlFree(attvalue);
	}

failed:

	GROW
	if ((RAW == '>') || (((RAW == '/') && (NXT(1) == '>'))))
	    break;
	if (SKIP_BLANKS == 0) {
	    xmlFatalErrMsg(ctxt, XML_ERR_SPACE_REQUIRED,
			   "attributes construct error\n");
	}
        if ((cons == CUR_CONSUMED) && (id == ctxt->input->id) &&
            (attname == NULL) && (attvalue == NULL)) {
	    xmlFatalErrMsg(ctxt, XML_ERR_INTERNAL_ERROR,
			   "xmlParseStartTag: problem parsing attributes\n");
	    break;
	}
	SHRINK;
        GROW;
    }

    /*
     * SAX: Start of Element !
     */
    if ((ctxt->sax != NULL) && (ctxt->sax->startElement != NULL) &&
	(!ctxt->disableSAX)) {
	if (nbatts > 0)
	    ctxt->sax->startElement(ctxt->userData, name, atts);
	else
	    ctxt->sax->startElement(ctxt->userData, name, NULL);
    }

    if (atts != NULL) {
        /* Free only the content strings */
        for (i = 1;i < nbatts;i+=2)
	    if (atts[i] != NULL)
	       xmlFree((xmlChar *) atts[i]);
    }
    return(name);
}